

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_components.c
# Opt level: O0

void key_components_free(key_components *kc)

{
  key_component *pkVar1;
  key_component *comp;
  size_t i;
  key_components *kc_local;
  
  comp = (key_component *)0x0;
  do {
    if ((key_component *)kc->ncomponents <= comp) {
      safefree(kc->components);
      safefree(kc);
      return;
    }
    pkVar1 = kc->components + (long)comp;
    safefree(pkVar1->name);
    if (pkVar1->type < KCT_MPINT) {
      strbuf_free((pkVar1->field_2).str);
    }
    else {
      if (pkVar1->type != KCT_MPINT) {
        __assert_fail("false && \"bad key component type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/key_components.c"
                      ,0x58,"void key_components_free(key_components *)");
      }
      mp_free((pkVar1->field_2).mp);
    }
    comp = (key_component *)((long)&comp->name + 1);
  } while( true );
}

Assistant:

void key_components_free(key_components *kc)
{
    for (size_t i = 0; i < kc->ncomponents; i++) {
        key_component *comp = &kc->components[i];
        sfree(comp->name);
        switch (comp->type) {
          case KCT_MPINT:
            mp_free(comp->mp);
            break;
          case KCT_TEXT:
          case KCT_BINARY:
            strbuf_free(comp->str);
            break;
          default:
            unreachable("bad key component type");
        }
    }
    sfree(kc->components);
    sfree(kc);
}